

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  int iVar4;
  int y;
  int iVar5;
  long lVar6;
  undefined2 *puVar7;
  undefined2 *puVar8;
  uint8_t *puVar9;
  long lVar10;
  
  iVar4 = (decode->chunk).height - decode->user_line_end_ignore;
  iVar5 = decode->user_line_begin_skip;
  if (iVar5 < iVar4) {
    peVar3 = decode->channels;
    uVar1 = peVar3->width;
    lVar6 = (long)(int)uVar1;
    puVar8 = (undefined2 *)((long)(int)(uVar1 * iVar5 * 6) + (long)decode->unpacked_buffer);
    puVar9 = peVar3[2].field_12.decode_to_ptr;
    iVar2 = peVar3->user_line_stride;
    do {
      if (0 < (int)uVar1) {
        lVar10 = 0;
        puVar7 = puVar8;
        do {
          *(undefined2 *)(puVar9 + lVar10) = puVar7[lVar6 * 2];
          *(undefined2 *)(puVar9 + lVar10 + 2) = puVar7[lVar6];
          *(undefined2 *)(puVar9 + lVar10 + 4) = *puVar7;
          puVar7 = puVar7 + 1;
          lVar10 = lVar10 + 6;
        } while ((ulong)uVar1 * 6 != lVar10);
      }
      puVar8 = puVar8 + lVar6 * 3;
      puVar9 = puVar9 + iVar2;
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer; // B
        in1 = in0 + w;                     // G
        in2 = in1 + w;                     // R

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in2[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in0[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}